

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::CopyImage::NonExistentMipMapTest::iterate(NonExistentMipMapTest *this)

{
  int iVar1;
  GLuint GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  size_type sVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_228;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  GetNameFunc local_1f8;
  int local_1f0;
  Enum<int,_2UL> local_1e8;
  MessageBuilder local_1d8;
  Exception *exc;
  reference local_40;
  testCase *test_case;
  byte local_2d;
  GLuint temp;
  bool result;
  long lStack_28;
  IterateResult it_result;
  Functions *gl;
  NonExistentMipMapTest *pNStack_18;
  GLenum error;
  NonExistentMipMapTest *this_local;
  
  gl._4_4_ = 0;
  pNStack_18 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  temp = 0;
  local_2d = 0;
  test_case._4_4_ = 0;
  local_40 = std::
             vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
             ::operator[](&this->m_test_cases,(ulong)this->m_test_case_index);
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,local_40->m_tex_target,0x8058,0x1908,0x1401,
                     (GLuint *)((long)&test_case + 4));
  this->m_dst_tex_name = GVar2;
  GVar2 = Utils::prepareTex16x16x6
                    ((this->super_TestCase).m_context,local_40->m_tex_target,0x8058,0x1908,0x1401,
                     (GLuint *)((long)&test_case + 4));
  this->m_src_tex_name = GVar2;
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,local_40->m_tex_target,this->m_dst_tex_name,0,0);
  Utils::makeTextureComplete
            ((this->super_TestCase).m_context,local_40->m_tex_target,this->m_src_tex_name,0,0);
  (**(code **)(lStack_28 + 0x310))
            (this->m_src_tex_name,local_40->m_tex_target,local_40->m_src_level,0,0,0,
             this->m_dst_tex_name,local_40->m_tex_target,local_40->m_dst_level,0,0,0,1,1,1);
  gl._4_4_ = (**(code **)(lStack_28 + 0x800))();
  local_2d = local_40->m_expected_result == gl._4_4_;
  clean(this);
  if ((local_2d & 1) == 1) {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_PASS,"Pass");
    this->m_test_case_index = this->m_test_case_index + 1;
    sVar5 = std::
            vector<gl4cts::CopyImage::NonExistentMipMapTest::testCase,_std::allocator<gl4cts::CopyImage::NonExistentMipMapTest::testCase>_>
            ::size(&this->m_test_cases);
    if (this->m_test_case_index < sVar5) {
      temp = 1;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_00 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [27])"Failure. Expected result: ")
    ;
    EVar7 = glu::getErrorStr(local_40->m_expected_result);
    local_1f8 = EVar7.m_getName;
    local_1f0 = EVar7.m_value;
    local_1e8.m_getName = local_1f8;
    local_1e8.m_value = local_1f0;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [7])0x2b39b91);
    EVar7 = glu::getErrorStr(gl._4_4_);
    local_218 = EVar7.m_getName;
    local_210 = EVar7.m_value;
    local_208.m_getName = local_218;
    local_208.m_value = local_210;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_208);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])". Texture target: ");
    EVar7 = glu::getTextureTargetStr(local_40->m_tex_target);
    local_228.m_getName = EVar7.m_getName;
    local_228.m_value = EVar7.m_value;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_228);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])", source level: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_40->m_src_level);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [22])", destination level: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_40->m_dst_level);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar4,QP_TEST_RESULT_FAIL,"Fail");
  }
  return temp;
}

Assistant:

tcu::TestNode::IterateResult NonExistentMipMapTest::iterate()
{
	GLenum						 error	 = GL_NO_ERROR;
	const Functions&			 gl		   = m_context.getRenderContext().getFunctions();
	tcu::TestNode::IterateResult it_result = tcu::TestNode::STOP;
	bool						 result	= false;
	GLuint						 temp	  = 0;
	const testCase&				 test_case = m_test_cases[m_test_case_index];

	try
	{
		/* Prepare textures */
		m_dst_tex_name =
			Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);
		m_src_tex_name =
			Utils::prepareTex16x16x6(m_context, test_case.m_tex_target, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE, temp);

		/* Make textures complete */
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_dst_tex_name, 0 /* base */, 0 /* max */);
		Utils::makeTextureComplete(m_context, test_case.m_tex_target, m_src_tex_name, 0 /* base */, 0 /* max */);
	}
	catch (tcu::Exception& exc)
	{
		clean();
		throw exc;
	}

	/* Execute CopyImageSubData */
	gl.copyImageSubData(m_src_tex_name, test_case.m_tex_target, test_case.m_src_level, 0 /* srcX */, 0 /* srcY */,
						0 /* srcZ */, m_dst_tex_name, test_case.m_tex_target, test_case.m_dst_level, 0 /* dstX */,
						0 /* dstY */, 0 /* dstZ */, 1 /* srcWidth */, 1 /* srcHeight */, 1 /* srcDepth */);

	/* Verify generated error */
	error  = gl.getError();
	result = (test_case.m_expected_result == error);

	/* Free resources */
	clean();

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

		/* Increase index */
		m_test_case_index += 1;

		/* Are there any test cases left */
		if (m_test_cases.size() > m_test_case_index)
		{
			it_result = tcu::TestNode::CONTINUE;
		}
	}
	else
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Failure. Expected result: " << glu::getErrorStr(test_case.m_expected_result)
			<< " got: " << glu::getErrorStr(error)
			<< ". Texture target: " << glu::getTextureTargetStr(test_case.m_tex_target)
			<< ", source level: " << test_case.m_src_level << ", destination level: " << test_case.m_dst_level
			<< tcu::TestLog::EndMessage;

		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return it_result;
}